

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

bool __thiscall
wasm::OptimizeInstructions::optimizeSubsequentStructSet
          (OptimizeInstructions *this,StructNew *new_,StructSet *set,Index refLocalIndex)

{
  ExpressionList *this_00;
  size_t *__return_storage_ptr__;
  bool bVar1;
  ulong index;
  size_type sVar2;
  Expression **ppEVar3;
  Drop *left;
  Block *pBVar4;
  uint uVar5;
  undefined1 local_330 [8];
  EffectAnalyzer setValueEffects;
  EffectAnalyzer operandEffects;
  Builder builder;
  Index local_34 [2];
  Index refLocalIndex_local;
  
  if ((((new_->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.type.id == 1) ||
      ((set->super_SpecificExpression<(wasm::Expression::Id)62>).super_Expression.type.id == 1)) ||
     ((new_->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements == 0)) {
    bVar1 = false;
  }
  else {
    uVar5 = set->index;
    index = (ulong)uVar5;
    local_34[0] = refLocalIndex;
    effects((EffectAnalyzer *)local_330,this,set->value);
    sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &setValueEffects.features,local_34);
    if (sVar2 == 0) {
      sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&setValueEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count,local_34);
      if (sVar2 == 0) {
        this_00 = &new_->operands;
        do {
          uVar5 = uVar5 + 1;
          if ((new_->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= (ulong)uVar5) {
            operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)(this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .currModule;
            ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,index);
            effects((EffectAnalyzer *)
                    &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count,this,*ppEVar3);
            bVar1 = EffectAnalyzer::hasUnremovableSideEffects
                              ((EffectAnalyzer *)
                               &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
            EffectAnalyzer::~EffectAnalyzer
                      ((EffectAnalyzer *)
                       &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
            if (bVar1) {
              ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        operator[](&this_00->
                                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   ,index);
              left = Builder::makeDrop((Builder *)
                                       &operandEffects.delegateTargets._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count,*ppEVar3);
              pBVar4 = Builder::makeSequence
                                 ((Builder *)
                                  &operandEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                   ._M_node_count,(Expression *)left,set->value);
            }
            else {
              pBVar4 = (Block *)set->value;
            }
            ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[](&this_00->
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                 ,index);
            *ppEVar3 = (Expression *)pBVar4;
            bVar1 = true;
            goto LAB_008e9f3f;
          }
          ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(ulong)uVar5);
          __return_storage_ptr__ =
               &setValueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
          effects((EffectAnalyzer *)__return_storage_ptr__,this,*ppEVar3);
          bVar1 = EffectAnalyzer::invalidates
                            ((EffectAnalyzer *)__return_storage_ptr__,(EffectAnalyzer *)local_330);
          EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)__return_storage_ptr__);
        } while (!bVar1);
      }
    }
    bVar1 = false;
LAB_008e9f3f:
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_330);
  }
  return bVar1;
}

Assistant:

bool optimizeSubsequentStructSet(StructNew* new_,
                                   StructSet* set,
                                   Index refLocalIndex) {
    // Leave unreachable code for DCE, to avoid updating types here.
    if (new_->type == Type::unreachable || set->type == Type::unreachable) {
      return false;
    }

    if (new_->isWithDefault()) {
      // Ignore a new_default for now. If the fields are defaultable then we
      // could add them, in principle, but that might increase code size.
      return false;
    }

    auto index = set->index;
    auto& operands = new_->operands;

    // Check for effects that prevent us moving the struct.set's value (X' in
    // the function comment) into its new position in the struct.new. First, it
    // must be ok to move it past the local.set (otherwise, it might read from
    // memory using that local, and depend on the struct.new having already
    // occurred; or, if it writes to that local, then it would cross another
    // write).
    auto setValueEffects = effects(set->value);
    if (setValueEffects.localsRead.count(refLocalIndex) ||
        setValueEffects.localsWritten.count(refLocalIndex)) {
      return false;
    }

    // We must move the set's value past indexes greater than it (Y and Z in
    // the example in the comment on this function).
    // TODO When this function is called repeatedly in a sequence this can
    //      become quadratic - perhaps we should memoize (though, struct sizes
    //      tend to not be ridiculously large).
    for (Index i = index + 1; i < operands.size(); i++) {
      auto operandEffects = effects(operands[i]);
      if (operandEffects.invalidates(setValueEffects)) {
        // TODO: we could use locals to reorder everything
        return false;
      }
    }

    Builder builder(*getModule());

    // See if we need to keep the old value.
    if (effects(operands[index]).hasUnremovableSideEffects()) {
      operands[index] =
        builder.makeSequence(builder.makeDrop(operands[index]), set->value);
    } else {
      operands[index] = set->value;
    }

    return true;
  }